

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O1

void __thiscall
LASquadtree::get_cell_bounding_box(LASquadtree *this,F64 x,F64 y,U32 level,F32 *min,F32 *max)

{
  F32 FVar1;
  F32 FVar2;
  F32 FVar3;
  F32 FVar4;
  F32 FVar5;
  F32 FVar6;
  float fVar7;
  float fVar8;
  float cell_mid_y;
  float cell_mid_x;
  
  FVar5 = this->min_x;
  FVar2 = this->max_x;
  FVar6 = this->min_y;
  FVar4 = this->max_y;
  FVar1 = FVar2;
  FVar3 = FVar4;
  if (level != 0) {
    do {
      fVar7 = ((float)FVar5 + (float)FVar1) * 0.5;
      fVar8 = ((float)FVar6 + (float)FVar3) * 0.5;
      FVar2 = (F32)fVar7;
      if ((double)fVar7 <= (double)x) {
        FVar2 = FVar1;
        FVar5 = (F32)fVar7;
      }
      FVar4 = (F32)fVar8;
      if ((double)fVar8 <= (double)y) {
        FVar4 = FVar3;
        FVar6 = (F32)fVar8;
      }
      level = level - 1;
      FVar1 = FVar2;
      FVar3 = FVar4;
    } while (level != 0);
  }
  if (min != (F32 *)0x0) {
    *min = FVar5;
    min[1] = FVar6;
  }
  if (max != (F32 *)0x0) {
    *max = FVar2;
    max[1] = FVar4;
  }
  return;
}

Assistant:

void LASquadtree::get_cell_bounding_box(const F64 x, const F64 y, U32 level, F32* min, F32* max) const
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  float cell_min_x, cell_max_x;
  float cell_min_y, cell_max_y;
  
  cell_min_x = min_x;
  cell_max_x = max_x;
  cell_min_y = min_y;
  cell_max_y = max_y;

  while (level)
  {
    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;
    if (x < cell_mid_x)
    {
      cell_max_x = cell_mid_x;
    }
    else
    {
      cell_min_x = cell_mid_x;
    }
    if (y < cell_mid_y)
    {
      cell_max_y = cell_mid_y;
    }
    else
    {
      cell_min_y = cell_mid_y;
    }
    level--;
  }
  if (min)
  {
    min[0] = cell_min_x;
    min[1] = cell_min_y;
  }
  if (max)
  {
    max[0] = cell_max_x;
    max[1] = cell_max_y;
  }
}